

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_diff_equivnode(lyd_node *first,lyd_node *second)

{
  int iVar1;
  
  while( true ) {
    if ((first == (lyd_node *)0x0) || (second == (lyd_node *)0x0)) {
      return (uint)(first == second);
    }
    if (first->schema != second->schema) {
      return 0;
    }
    if ((first->schema->nodetype == LYS_LIST) &&
       (iVar1 = lyd_list_equal(first,second,0,0,0), iVar1 != 1)) break;
    first = first->parent;
    second = second->parent;
  }
  return 0;
}

Assistant:

static int
lyd_diff_equivnode(struct lyd_node *first, struct lyd_node *second)
{
    struct lyd_node *iter1, *iter2;

    for (iter1 = first, iter2 = second; iter1 && iter2; iter1 = iter1->parent, iter2 = iter2->parent) {
        if (iter1->schema != iter2->schema) {
            return 0;
        }
        if (iter1->schema->nodetype == LYS_LIST) {
            /* compare keys */
            if (lyd_list_equal(iter1, iter2, 0, 0, 0) != 1) {
                return 0;
            }
        }
    }

    if (iter1 != iter2) {
        /* we are supposed to be in root (NULL) in both trees */
        return 0;
    }

    return 1;
}